

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

ON_Line * __thiscall
ON_Plane::IsoLine(ON_Line *__return_storage_ptr__,ON_Plane *this,int dir,double c)

{
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_3dPoint local_48;
  undefined1 local_29;
  double local_28;
  double c_local;
  ON_Plane *pOStack_18;
  int dir_local;
  ON_Plane *this_local;
  ON_Line *line;
  
  local_29 = 0;
  local_28 = c;
  c_local._4_4_ = dir;
  pOStack_18 = this;
  this_local = (ON_Plane *)__return_storage_ptr__;
  ON_Line::ON_Line(__return_storage_ptr__);
  if (c_local._4_4_ == 0) {
    PointAt(&local_88,this,local_28,0.0);
    (__return_storage_ptr__->from).z = local_88.z;
    (__return_storage_ptr__->from).x = local_88.x;
    (__return_storage_ptr__->from).y = local_88.y;
    PointAt(&local_a0,this,local_28,1.0);
    (__return_storage_ptr__->to).x = local_a0.x;
    (__return_storage_ptr__->to).y = local_a0.y;
    (__return_storage_ptr__->to).z = local_a0.z;
  }
  else {
    PointAt(&local_48,this,0.0,local_28);
    (__return_storage_ptr__->from).z = local_48.z;
    (__return_storage_ptr__->from).x = local_48.x;
    (__return_storage_ptr__->from).y = local_48.y;
    PointAt(&local_70,this,1.0,local_28);
    (__return_storage_ptr__->to).x = local_70.x;
    (__return_storage_ptr__->to).y = local_70.y;
    (__return_storage_ptr__->to).z = local_70.z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_Plane::IsoLine( // iso parametric line
       int dir,              // 0 first parameter varies and second parameter is constant
                         //   e.g., line(t) = plane(t,c)
                         // 1 first parameter is constant and second parameter varies
                         //   e.g., line(t) = plane(c,t)
       double c           // c = value of constant parameter 
       ) const
{
  ON_Line line;
  if ( dir ) {
    line.from = PointAt( 0.0, c );
    line.to   = PointAt( 1.0, c );
  }
  else {
    line.from = PointAt( c, 0.0 );
    line.to   = PointAt( c, 1.0 );
  }
  return line;
}